

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_NtkFree(Acb_Ntk_t *p)

{
  Acb_Ntk_t *p_local;
  
  Vec_IntErase(&p->vCis);
  Vec_IntErase(&p->vCos);
  Vec_IntErase(&p->vOrder);
  Vec_IntErase(&p->vSeq);
  Vec_StrErase(&p->vObjType);
  Vec_IntErase(&p->vObjFans);
  Vec_IntErase(&p->vFanSto);
  Vec_IntErase(&p->vObjCopy);
  Vec_IntErase(&p->vObjFunc);
  Vec_IntErase(&p->vObjWeight);
  Vec_WrdErase(&p->vObjTruth);
  Vec_IntErase(&p->vObjName);
  Vec_IntErase(&p->vObjRange);
  Vec_IntErase(&p->vObjTrav);
  Vec_IntErase(&p->vObjBits);
  Vec_IntErase(&p->vObjAttr);
  Vec_IntErase(&p->vAttrSto);
  Vec_IntErase(&p->vNtkObjs);
  Vec_IntErase(&p->vTargets);
  Vec_IntErase(&p->vLevelD);
  Vec_IntErase(&p->vLevelR);
  Vec_IntErase(&p->vPathD);
  Vec_IntErase(&p->vPathR);
  Vec_FltErase(&p->vCounts);
  Vec_WecErase(&p->vFanouts);
  Vec_WecErase(&p->vCnfs);
  Vec_StrErase(&p->vCnf);
  Vec_IntErase(&p->vSuppOld);
  Vec_QueFreeP(&p->vQue);
  Vec_IntErase(&p->vCover);
  Vec_IntErase(&p->vArray0);
  Vec_IntErase(&p->vArray1);
  Vec_IntErase(&p->vArray2);
  if (p != (Acb_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Acb_NtkFree( Acb_Ntk_t * p )
{
    // interface
    Vec_IntErase( &p->vCis );
    Vec_IntErase( &p->vCos );
    Vec_IntErase( &p->vOrder );
    Vec_IntErase( &p->vSeq );
    // stucture
    Vec_StrErase( &p->vObjType );
    Vec_IntErase( &p->vObjFans );    
    Vec_IntErase( &p->vFanSto );
    // optional
    Vec_IntErase( &p->vObjCopy );    
    Vec_IntErase( &p->vObjFunc );    
    Vec_IntErase( &p->vObjWeight );    
    Vec_WrdErase( &p->vObjTruth );    
    Vec_IntErase( &p->vObjName );    
    Vec_IntErase( &p->vObjRange );    
    Vec_IntErase( &p->vObjTrav );    
    Vec_IntErase( &p->vObjBits );    
    Vec_IntErase( &p->vObjAttr );    
    Vec_IntErase( &p->vAttrSto );    
    Vec_IntErase( &p->vNtkObjs );    
    Vec_IntErase( &p->vTargets );    
    Vec_IntErase( &p->vLevelD );    
    Vec_IntErase( &p->vLevelR );    
    Vec_IntErase( &p->vPathD );    
    Vec_IntErase( &p->vPathR );    
    Vec_FltErase( &p->vCounts );    
    Vec_WecErase( &p->vFanouts );
    Vec_WecErase( &p->vCnfs );    
    Vec_StrErase( &p->vCnf );    
    Vec_IntErase( &p->vSuppOld );    
    // other
    Vec_QueFreeP( &p->vQue );
    Vec_IntErase( &p->vCover );    
    Vec_IntErase( &p->vArray0 );    
    Vec_IntErase( &p->vArray1 );    
    Vec_IntErase( &p->vArray2 );    
    ABC_FREE( p );
}